

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

String * __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::BuildGLSLSource_abi_cxx11_
          (String *__return_storage_ptr__,ConversionStream *this)

{
  uint uVar1;
  _List_node_base *p_Var2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var2 = (_List_node_base *)&this->m_Tokens;
  while (p_Var2 = (((_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->m_Tokens) {
    uVar1 = *(int *)&p_Var2[1]._M_next - 0xd2;
    if ((0x39 < uVar1) || ((0x200000640000001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String HLSL2GLSLConverterImpl::ConversionStream::BuildGLSLSource()
{
    String Output;
    for (const auto& Token : m_Tokens)
    {
        if ((Token.Type == TokenType::kw_linear ||
             Token.Type == TokenType::kw_nointerpolation ||
             Token.Type == TokenType::kw_noperspective ||
             Token.Type == TokenType::kw_centroid ||
             Token.Type == TokenType::kw_sample))
        {
            // Skip interpolation qualifiers.
            // We may get here if there are multiple shader functions in the same file.
            continue;
        }

        Output.append(Token.Delimiter);
        Output.append(Token.Literal);
    }
    return Output;
}